

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O3

void connection_cb(uv_stream_t *server,int status)

{
  int iVar1;
  undefined8 *extraout_RDX;
  uv_connect_t *puVar2;
  int64_t eval_b;
  uv_buf_t buf;
  int64_t eval_b_4;
  void *local_20;
  char *local_18;
  uv_req_type local_10;
  undefined4 uStack_c;
  void *local_8;
  
  if (server == (uv_stream_t *)&tcp_server) {
    local_18 = (char *)(long)status;
    local_20 = (void *)0x0;
    if ((uv_loop_t *)local_18 != (uv_loop_t *)0x0) goto LAB_001d197c;
    iVar1 = uv_tcp_init(tcp_server.loop,&tcp_peer);
    local_18 = (char *)(long)iVar1;
    local_20 = (void *)0x0;
    if ((uv_loop_t *)local_18 != (uv_loop_t *)0x0) goto LAB_001d198b;
    iVar1 = uv_accept(&tcp_server,&tcp_peer);
    local_18 = (char *)(long)iVar1;
    local_20 = (void *)0x0;
    if ((uv_loop_t *)local_18 != (uv_loop_t *)0x0) goto LAB_001d199a;
    iVar1 = uv_read_start(&tcp_peer,alloc_cb,read_cb);
    local_18 = (char *)(long)iVar1;
    local_20 = (void *)0x0;
    if ((uv_loop_t *)local_18 == (uv_loop_t *)0x0) {
      local_18 = "hello\n";
      local_10 = UV_FS;
      uStack_c = 0;
      iVar1 = uv_write(&write_req,&tcp_peer,&stack0xffffffffffffffe8,1,write_cb);
      local_20 = (void *)(long)iVar1;
      local_8 = (void *)0x0;
      if (local_20 == (void *)0x0) {
        return;
      }
      goto LAB_001d19b8;
    }
  }
  else {
    connection_cb_cold_1();
LAB_001d197c:
    connection_cb_cold_2();
LAB_001d198b:
    connection_cb_cold_3();
LAB_001d199a:
    connection_cb_cold_4();
  }
  connection_cb_cold_5();
LAB_001d19b8:
  puVar2 = (uv_connect_t *)&stack0xffffffffffffffe0;
  iVar1 = (int)&stack0xfffffffffffffff8;
  connection_cb_cold_6();
  if (puVar2 == &connect_req) {
    if (iVar1 == 0) {
      uv_close(&tcp_client,0);
      return;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return;
}

Assistant:

static void connection_cb(uv_stream_t* handle, int status) {
  int r;

  ASSERT_OK(status);
  ASSERT_OK(uv_accept(handle, (uv_stream_t*) &peer_handle));
  ASSERT_OK(uv_fileno((uv_handle_t*) &peer_handle, &server_fd));
  ASSERT_OK(uv_poll_init(uv_default_loop(), &poll_req[0], client_fd));
  ASSERT_OK(uv_poll_init(uv_default_loop(), &poll_req[1], server_fd));
  ASSERT_OK(uv_poll_start(&poll_req[0],
                          UV_PRIORITIZED | UV_READABLE | UV_WRITABLE,
                          poll_cb));
  ASSERT_OK(uv_poll_start(&poll_req[1], UV_READABLE, poll_cb));
  do {
    r = send(server_fd, "hello", 5, MSG_OOB);
  } while (r < 0 && errno == EINTR);
  ASSERT_EQ(5, r);

  do {
    r = send(server_fd, "world", 5, 0);
  } while (r < 0 && errno == EINTR);
  ASSERT_EQ(5, r);

  ASSERT_OK(uv_idle_start(&idle, idle_cb));
}